

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libnbt.h
# Opt level: O1

int __thiscall libnbt::NBTTagVector<long>::remove(NBTTagVector<long> *this,char *__filename)

{
  pointer *pplVar1;
  pointer plVar2;
  pointer plVar3;
  pointer __src;
  char *pcVar4;
  
  plVar3 = (this->array).super__Vector_base<long,_std::allocator<long>_>._M_impl.
           super__Vector_impl_data._M_start;
  plVar2 = (this->array).super__Vector_base<long,_std::allocator<long>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pcVar4 = (char *)((long)plVar2 - (long)plVar3 >> 3);
  if (__filename < pcVar4) {
    __src = plVar3 + (long)(__filename + 1);
    if (__src != plVar2) {
      plVar3 = (pointer)memmove(plVar3 + (long)__filename,__src,(long)plVar2 - (long)__src);
    }
    pplVar1 = &(this->array).super__Vector_base<long,_std::allocator<long>_>._M_impl.
               super__Vector_impl_data._M_finish;
    *pplVar1 = *pplVar1 + -1;
  }
  return (int)CONCAT71((int7)((ulong)plVar3 >> 8),__filename < pcVar4);
}

Assistant:

virtual bool remove(size_t index) {
            if (index < array.size()) {
                array.erase(array.begin() + index);
                return true;
            }
            return false;
        }